

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

void __thiscall roaring::Roaring64Map::flipClosed(Roaring64Map *this,uint64_t min,uint64_t max)

{
  iterator iter;
  _Base_ptr p_Var1;
  uint32_t end_high;
  uint start_high;
  int iVar2;
  _Self __tmp;
  bool bVar3;
  
  if (max < min) {
    return;
  }
  start_high = (uint)(min >> 0x20);
  end_high = (uint32_t)(max >> 0x20);
  iter = ensureRangePopulated(this,start_high,end_high);
  if (min >> 0x20 != max >> 0x20) {
    iVar2 = ~start_high + end_high;
    Roaring::flipClosed((Roaring *)&iter._M_node[1]._M_parent,(uint32_t)min,0xffffffff);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
    eraseIfEmpty(this,iter);
    min = 0;
    iter._M_node = p_Var1;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      Roaring::flipClosed((Roaring *)&iter._M_node[1]._M_parent,0,0xffffffff);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
      eraseIfEmpty(this,iter);
      iter._M_node = p_Var1;
    }
  }
  Roaring::flipClosed((Roaring *)&iter._M_node[1]._M_parent,(uint32_t)min,(uint32_t)max);
  eraseIfEmpty(this,iter);
  return;
}

Assistant:

void flipClosed(uint64_t min, uint64_t max) {
        if (min > max) {
            return;
        }
        uint32_t start_high = highBytes(min);
        uint32_t start_low = lowBytes(min);
        uint32_t end_high = highBytes(max);
        uint32_t end_low = lowBytes(max);

        // We put std::numeric_limits<>::max in parentheses to avoid a
        // clash with the Windows.h header under Windows.
        const uint32_t uint32_max = (std::numeric_limits<uint32_t>::max)();

        // Fill in any nonexistent slots with empty Roarings. This simplifies
        // the logic below, allowing it to simply iterate over the map between
        // 'start_high' and 'end_high' in a linear fashion.
        auto current_iter = ensureRangePopulated(start_high, end_high);

        // If start and end land on the same inner bitmap, then we can do the
        // whole operation in one call.
        if (start_high == end_high) {
            auto &bitmap = current_iter->second;
            bitmap.flipClosed(start_low, end_low);
            eraseIfEmpty(current_iter);
            return;
        }

        // Because start and end don't land on the same inner bitmap,
        // we need to do this in multiple steps:
        // 1. Partially flip the first bitmap in the closed interval
        //    [start_low, uint32_max]
        // 2. Flip intermediate bitmaps completely: [0, uint32_max]
        // 3. Partially flip the last bitmap in the closed interval
        //    [0, end_low]

        auto num_intermediate_bitmaps = end_high - start_high - 1;

        // 1. Partially flip the first bitmap.
        {
            auto &bitmap = current_iter->second;
            bitmap.flipClosed(start_low, uint32_max);
            auto temp = current_iter++;
            eraseIfEmpty(temp);
        }

        // 2. Flip intermediate bitmaps completely.
        for (uint32_t i = 0; i != num_intermediate_bitmaps; ++i) {
            auto &bitmap = current_iter->second;
            bitmap.flipClosed(0, uint32_max);
            auto temp = current_iter++;
            eraseIfEmpty(temp);
        }

        // 3. Partially flip the last bitmap.
        auto &bitmap = current_iter->second;
        bitmap.flipClosed(0, end_low);
        eraseIfEmpty(current_iter);
    }